

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::BuildsystemFileScope::BuildsystemFileScope(BuildsystemFileScope *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmake *pcVar3;
  PositionType PVar4;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar5;
  char *pcVar6;
  cmState *pcVar7;
  string currentStart;
  allocator local_71;
  string local_70;
  Directory local_50;
  
  this->Makefile = mf;
  cmState::Snapshot::Snapshot(&this->Snapshot,(cmState *)0x0);
  this->ReportError = true;
  cmState::Snapshot::GetDirectory(&local_50,&this->Makefile->StateSnapshot);
  pcVar6 = cmState::Directory::GetCurrentSource(&local_50);
  std::__cxx11::string::string((string *)&local_70,pcVar6,&local_71);
  std::__cxx11::string::append((char *)&local_70);
  cmState::Snapshot::SetListFile(&this->Makefile->StateSnapshot,&local_70);
  pcVar7 = cmState::Snapshot::GetState(&this->Makefile->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot((Snapshot *)&local_50,pcVar7,this->Makefile->StateSnapshot);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = (PositionType)local_50.Snapshot_.State;
  (pcVar1->StateSnapshot).State = (cmState *)local_50.DirectoryState.Tree;
  (pcVar1->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmState::SnapshotDataType> *)local_50.DirectoryState.Position;
  PushFunctionBlockerBarrier(this->Makefile);
  pcVar2 = mf->GlobalGenerator;
  this->GG = pcVar2;
  this->CurrentMakefile = pcVar2->CurrentMakefile;
  pcVar3 = pcVar2->CMakeInstance;
  pcVar7 = (pcVar3->CurrentSnapshot).State;
  pcVar5 = (pcVar3->CurrentSnapshot).Position.Tree;
  PVar4 = (pcVar3->CurrentSnapshot).Position.Position;
  (this->Snapshot).Position.Position = PVar4;
  (this->Snapshot).State = pcVar7;
  (this->Snapshot).Position.Tree = pcVar5;
  pcVar3 = pcVar2->CMakeInstance;
  (pcVar3->CurrentSnapshot).Position.Position = PVar4;
  (pcVar3->CurrentSnapshot).State = pcVar7;
  (pcVar3->CurrentSnapshot).Position.Tree = pcVar5;
  pcVar2 = this->GG;
  pcVar2->CurrentMakefile = mf;
  cmFileLockPool::PushFileScope(&pcVar2->FileLockPool);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BuildsystemFileScope(cmMakefile* mf)
    : Makefile(mf), ReportError(true)
  {
    std::string currentStart =
        this->Makefile->StateSnapshot.GetDirectory().GetCurrentSource();
    currentStart += "/CMakeLists.txt";
    this->Makefile->StateSnapshot.SetListFile(currentStart);
    this->Makefile->StateSnapshot = this->Makefile->StateSnapshot.GetState()
        ->CreatePolicyScopeSnapshot(this->Makefile->StateSnapshot);
    this->Makefile->PushFunctionBlockerBarrier();

    this->GG = mf->GetGlobalGenerator();
    this->CurrentMakefile = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    this->GG->SetCurrentMakefile(mf);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PushFileScope();
#endif
  }